

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O3

SRC_STATE * src_clone(SRC_STATE *orig,int *error)

{
  SRC_STATE *pSVar1;
  int iVar2;
  
  if (orig == (SRC_STATE *)0x0) {
    iVar2 = 2;
    if (error == (int *)0x0) {
      return (SRC_STATE *)0x0;
    }
  }
  else {
    if (error != (int *)0x0) {
      *error = 0;
    }
    pSVar1 = (*orig->vt->copy)(orig);
    iVar2 = 1;
    if (pSVar1 != (SRC_STATE *)0x0 || error == (int *)0x0) {
      return pSVar1;
    }
  }
  *error = iVar2;
  return (SRC_STATE *)0x0;
}

Assistant:

SRC_STATE*
src_clone (SRC_STATE* orig, int *error)
{
	if (!orig)
	{
		if (error)
			*error = SRC_ERR_BAD_STATE ;
		return NULL ;
	}
	if (error)
		*error = SRC_ERR_NO_ERROR ;

	SRC_STATE *state = orig->vt->copy (orig) ;
	if (!state)
		if (error)
			*error = SRC_ERR_MALLOC_FAILED ;

	return state ;
}